

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_event_epoll.c
# Opt level: O0

int mk_event_wait_2(mk_event_loop *loop,int timeout)

{
  int iVar1;
  int timeout_local;
  mk_event_loop *loop_local;
  
  iVar1 = _mk_event_wait_2(loop,timeout);
  return iVar1;
}

Assistant:

static inline int _mk_event_wait_2(struct mk_event_loop *loop, int timeout)
{
    struct mk_event_ctx *ctx = loop->data;
    int ret = 0;

    while(1) {
        ret = epoll_wait(ctx->efd, ctx->events, ctx->queue_size, timeout);
        if (ret >= 0) {
            break;
        }
        else if(ret < 0 && errno != EINTR) {
            mk_libc_error("epoll_wait");
            break;
        }
        /* retry when errno is EINTR */
    }
    loop->n_events = ret;
    return ret;
}